

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotLine<float>
               (char *label_id,float *values,int count,double xscale,double x0,int offset,int stride
               )

{
  undefined1 local_60 [8];
  GetterYs<float> getter;
  int stride_local;
  int offset_local;
  double x0_local;
  double xscale_local;
  int count_local;
  float *values_local;
  char *label_id_local;
  
  getter.Offset = stride;
  getter.Stride = offset;
  GetterYs<float>::GetterYs((GetterYs<float> *)local_60,values,count,xscale,x0,offset,stride);
  PlotLineEx<ImPlot::GetterYs<float>>(label_id,(GetterYs<float> *)local_60);
  return;
}

Assistant:

void PlotLine(const char* label_id, const T* values, int count, double xscale, double x0, int offset, int stride) {
    GetterYs<T> getter(values,count,xscale,x0,offset,stride);
    PlotLineEx(label_id, getter);
}